

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
SubprocessTestInterruptParentWithSigTerm::Run(SubprocessTestInterruptParentWithSigTerm *this)

{
  bool bVar1;
  Subprocess *pSVar2;
  bool interrupted;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestInterruptParentWithSigTerm *this_local;
  
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"kill -TERM $PPID ; sleep 1",&local_39);
  pSVar2 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar2;
  bVar1 = testing::Test::Check
                    (g_current_test,pSVar2 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x72,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    do {
      bVar1 = Subprocess::Done(local_18);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = testing::Test::Check
                          (g_current_test,false,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                           ,0x7a,"\"We should have been interrupted\"");
        if (bVar1) {
          return;
        }
        testing::Test::AddAssertionFailure(g_current_test);
        return;
      }
      bVar1 = SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_);
    } while (!bVar1);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigTerm) {
  Subprocess* subproc = subprocs_.Add("kill -TERM $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}